

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O0

int mjs::function_object::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  uint32_t uVar2;
  gc_heap *args;
  function_object *pfVar3;
  gc_heap_ptr<mjs::gc_string> *name;
  bound_function_args *this;
  int *piVar4;
  undefined4 in_register_0000003c;
  anon_class_32_2_7e7847d8_for_f local_d0;
  int local_b0 [2];
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string local_98;
  anon_class_32_2_7e7847d8_for_f local_88;
  undefined1 local_68 [8];
  gc_heap_ptr<mjs::function_object> res;
  undefined1 local_48 [8];
  gc_heap_ptr<mjs::bound_function_args> bound_args;
  gc_heap_ptr<mjs::global_object> global;
  gc_heap *h;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  gc_heap_ptr<mjs::function_object> *f_local;
  
  args = gc_heap_ptr_untyped::heap((gc_heap_ptr_untyped *)__addr);
  pfVar3 = gc_heap_ptr<mjs::function_object>::operator->
                     ((gc_heap_ptr<mjs::function_object> *)__addr);
  gc_heap_ptr_untracked<mjs::global_object,_true>::track
            ((gc_heap_ptr_untracked<mjs::global_object,_true> *)
             &bound_args.super_gc_heap_ptr_untyped.pos_,
             (gc_heap *)&(pfVar3->super_native_object).field_0x24);
  gc_heap::
  make<mjs::bound_function_args,mjs::gc_heap&,std::vector<mjs::value,std::allocator<mjs::value>>const&>
            ((gc_heap *)local_48,args,(vector<mjs::value,_std::allocator<mjs::value>_> *)args);
  gc_heap_ptr<mjs::function_object>::gc_heap_ptr
            (&local_88.f,(gc_heap_ptr<mjs::function_object> *)__addr);
  gc_heap_ptr<mjs::bound_function_args>::gc_heap_ptr
            (&local_88.bound_args,(gc_heap_ptr<mjs::bound_function_args> *)local_48);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"");
  string::string(&local_98,args,&local_a8);
  name = string::unsafe_raw_get(&local_98);
  local_b0[1] = 0;
  pfVar3 = gc_heap_ptr<mjs::function_object>::operator->
                     ((gc_heap_ptr<mjs::function_object> *)__addr);
  iVar1 = pfVar3->named_args_;
  this = gc_heap_ptr<mjs::bound_function_args>::operator->
                   ((gc_heap_ptr<mjs::bound_function_args> *)local_48);
  uVar2 = bound_function_args::bound_args_len(this);
  local_b0[0] = iVar1 - uVar2;
  piVar4 = std::max<int>(local_b0 + 1,local_b0);
  make_function<mjs::function_object::bind(mjs::gc_heap_ptr<mjs::function_object>const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)::__0>
            ((mjs *)local_68,
             (gc_heap_ptr<mjs::global_object> *)&bound_args.super_gc_heap_ptr_untyped.pos_,&local_88
             ,name,*piVar4);
  string::~string(&local_98);
  bind(mjs::gc_heap_ptr<mjs::function_object>const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)
  ::$_0::~__0((__0 *)&local_88);
  gc_heap_ptr<mjs::function_object>::gc_heap_ptr
            (&local_d0.f,(gc_heap_ptr<mjs::function_object> *)__addr);
  gc_heap_ptr<mjs::bound_function_args>::gc_heap_ptr
            (&local_d0.bound_args,(gc_heap_ptr<mjs::bound_function_args> *)local_48);
  make_constructable<mjs::function_object::bind(mjs::gc_heap_ptr<mjs::function_object>const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)::__1>
            ((gc_heap_ptr<mjs::global_object> *)&bound_args.super_gc_heap_ptr_untyped.pos_,
             (gc_heap_ptr<mjs::function_object> *)local_68,&local_d0);
  bind(mjs::gc_heap_ptr<mjs::function_object>const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)
  ::$_1::~__1((__1 *)&local_d0);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            ((gc_heap_ptr<mjs::object> *)CONCAT44(in_register_0000003c,__fd),
             (gc_heap_ptr<mjs::function_object> *)local_68);
  gc_heap_ptr<mjs::function_object>::~gc_heap_ptr((gc_heap_ptr<mjs::function_object> *)local_68);
  gc_heap_ptr<mjs::bound_function_args>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::bound_function_args> *)local_48);
  gc_heap_ptr<mjs::global_object>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::global_object> *)&bound_args.super_gc_heap_ptr_untyped.pos_);
  return __fd;
}

Assistant:

object_ptr function_object::bind(const gc_heap_ptr<function_object>& f, const std::vector<value>& args) {
    auto& h = f.heap();
    auto global = f->global_.track(h);
    auto bound_args = h.make<bound_function_args>(h, args);

    // Actually need to create object to store "args" (thisArg and the extra (needed?) arguments)
    // Put it in a special pointer in function? (will help with the type checks)

    // ES5.1, 15.3.4.5
    auto res = make_function(global, [f, bound_args](const value&, const std::vector<value>& args) {
        return f->call(bound_args->bound_this(), bound_args->build_args(args));
    }, string{h,""}.unsafe_raw_get(), std::max(0,  f->named_args_ - static_cast<int>(bound_args->bound_args_len())));

    make_constructable(global, res, [f, bound_args](const value&, const std::vector<value>& args) {
        return f->construct(value::undefined, bound_args->build_args(args));
    });
    
    return res;
}